

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void matchit::impl::
     PatternTraits<matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
     ::processIdImpl(Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                     *idPat,int32_t depth,IdProcess idProcess)

{
  IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  *pIVar1;
  
  if (idProcess == kCONFIRM) {
    pIVar1 = &Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
              ::block(idPat)->
              super_IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
    ;
    IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
    ::confirm(pIVar1,depth);
    return;
  }
  if (idProcess != kCANCEL) {
    return;
  }
  pIVar1 = &Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
            ::block(idPat)->
            super_IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ;
  IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  ::reset(pIVar1,depth);
  return;
}

Assistant:

constexpr static void processIdImpl(Id<Type> const &idPat, int32_t depth,
                                                IdProcess idProcess)
            {
                switch (idProcess)
                {
                case IdProcess::kCANCEL:
                    idPat.reset(depth);
                    break;

                case IdProcess::kCONFIRM:
                    idPat.confirm(depth);
                    break;
                }
            }